

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_utl.c
# Opt level: O0

int ossl_asn1_do_lock(ASN1_VALUE **pval,int op,ASN1_ITEM *it)

{
  long lVar1;
  int iVar2;
  int *val;
  long *plVar3;
  CRYPTO_RWLOCK *pCVar4;
  char *in_RDX;
  int in_ESI;
  long *in_RDI;
  int ret;
  CRYPTO_RWLOCK **lock;
  CRYPTO_REF_COUNT *lck;
  ASN1_AUX *aux;
  int local_4;
  
  local_4 = -1;
  if ((*in_RDX == '\x01') || (*in_RDX == '\x06')) {
    lVar1 = *(long *)(in_RDX + 0x20);
    if ((lVar1 == 0) || ((*(uint *)(lVar1 + 8) & 1) == 0)) {
      local_4 = 0;
    }
    else {
      val = (int *)(*in_RDI + (long)*(int *)(lVar1 + 0xc));
      plVar3 = (long *)(*in_RDI + (long)*(int *)(lVar1 + 0x10));
      if (in_ESI == -1) {
        iVar2 = CRYPTO_DOWN_REF(val,(int *)&stack0xffffffffffffffc4,(void *)*plVar3);
        if (iVar2 == 0) {
          local_4 = -1;
        }
        else if (local_4 == 0) {
          CRYPTO_THREAD_lock_free((CRYPTO_RWLOCK *)0x3846c0);
          *plVar3 = 0;
        }
      }
      else if (in_ESI == 0) {
        local_4 = 1;
        LOCK();
        *val = 1;
        UNLOCK();
        pCVar4 = CRYPTO_THREAD_lock_new();
        *plVar3 = (long)pCVar4;
        if (*plVar3 == 0) {
          ERR_new();
          ERR_set_debug((char *)val,(int)((ulong)plVar3 >> 0x20),(char *)CONCAT44(local_4,in_ESI));
          ERR_set_error(0xd,0xc0100,(char *)0x0);
          local_4 = -1;
        }
      }
      else if ((in_ESI == 1) &&
              (iVar2 = CRYPTO_UP_REF(val,(int *)&stack0xffffffffffffffc4,(void *)*plVar3),
              iVar2 == 0)) {
        local_4 = -1;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ossl_asn1_do_lock(ASN1_VALUE **pval, int op, const ASN1_ITEM *it)
{
    const ASN1_AUX *aux;
    CRYPTO_REF_COUNT *lck;
    CRYPTO_RWLOCK **lock;
    int ret = -1;

    if ((it->itype != ASN1_ITYPE_SEQUENCE)
        && (it->itype != ASN1_ITYPE_NDEF_SEQUENCE))
        return 0;
    aux = it->funcs;
    if (aux == NULL || (aux->flags & ASN1_AFLG_REFCOUNT) == 0)
        return 0;
    lck = offset2ptr(*pval, aux->ref_offset);
    lock = offset2ptr(*pval, aux->ref_lock);

    switch (op) {
    case 0:
        *lck = ret = 1;
        *lock = CRYPTO_THREAD_lock_new();
        if (*lock == NULL) {
            ERR_raise(ERR_LIB_ASN1, ERR_R_MALLOC_FAILURE);
            return -1;
        }
        break;
    case 1:
        if (!CRYPTO_UP_REF(lck, &ret, *lock))
            return -1;
        break;
    case -1:
        if (!CRYPTO_DOWN_REF(lck, &ret, *lock))
            return -1;  /* failed */
        REF_PRINT_EX(it->sname, ret, (void *)it);
        REF_ASSERT_ISNT(ret < 0);
        if (ret == 0) {
            CRYPTO_THREAD_lock_free(*lock);
            *lock = NULL;
        }
        break;
    }

    return ret;
}